

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_3,_2> *
deqp::gles3::Functional::MatrixCaseUtils::decrement<float,3,2>(Matrix<float,_3,_2> *mat)

{
  Vector<float,_3> *pVVar1;
  int row;
  long lVar2;
  Matrix<float,_3,_2> *retVal;
  Matrix<float,_3,_2> *in_RDI;
  float fVar3;
  
  (in_RDI->m_data).m_data[0].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((in_RDI->m_data).m_data[0].m_data + 2) = 0;
  pVVar1 = (in_RDI->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  lVar2 = 0;
  do {
    fVar3 = 1.0;
    if (lVar2 != 0) {
      fVar3 = 0.0;
    }
    (in_RDI->m_data).m_data[0].m_data[lVar2] = fVar3;
    fVar3 = 1.0;
    if (lVar2 != 1) {
      fVar3 = 0.0;
    }
    (in_RDI->m_data).m_data[1].m_data[lVar2] = fVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = -3;
  do {
    (in_RDI->m_data).m_data[1].m_data[lVar2] = (mat->m_data).m_data[1].m_data[lVar2] + -1.0;
    in_RDI[1].m_data.m_data[0].m_data[lVar2] = mat[1].m_data.m_data[0].m_data[lVar2] + -1.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return in_RDI;
}

Assistant:

tcu::Matrix<T, Rows, Cols> decrement (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) - 1.0f;

	return retVal;
}